

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O0

uint64_t assembler::anon_unknown_0::fill_vm_bytecode(instruction *instr,uint8_t *opcode_stream)

{
  bool bVar1;
  bool local_33;
  bool local_32;
  bool local_31;
  int local_30;
  bool savemem2;
  bool savemem1;
  bool savemem;
  int nr_ops;
  uint8_t op2mem;
  uint8_t op1mem;
  uint64_t sz;
  uint8_t *opcode_stream_local;
  instruction *instr_local;
  
  _nr_ops = (instruction *)0x0;
  sz = (uint64_t)opcode_stream;
  opcode_stream_local = (uint8_t *)instr;
  bVar1 = ignore_operation_as_bytecode(&instr->oper);
  if (bVar1) {
    instr_local = _nr_ops;
  }
  else {
    *(char *)((long)&_nr_ops->oper + sz) = (char)*(undefined4 *)opcode_stream_local;
    savemem = false;
    savemem1 = false;
    _nr_ops = (instruction *)((long)&_nr_ops->oper + 1);
    local_30 = number_of_operands((operation *)opcode_stream_local);
    if (local_30 == 1) {
      local_31 = true;
      get_memory_size_type
                (&savemem,&local_31,(operation *)opcode_stream_local,
                 (operand *)(opcode_stream_local + 4),*(uint64_t *)(opcode_stream_local + 0x10));
      if ((local_31 & 1U) == 0) {
        *(byte *)((long)&_nr_ops->oper + sz) = (byte)*(undefined4 *)(opcode_stream_local + 4) | 0x80
        ;
        _nr_ops = (instruction *)((long)&_nr_ops->oper + 1);
      }
      else {
        *(char *)((long)&_nr_ops->oper + sz) = (char)*(undefined4 *)(opcode_stream_local + 4);
        *(bool *)((long)&_nr_ops->oper + sz + 1) = savemem;
        _nr_ops = (instruction *)((long)&_nr_ops->oper + 2);
      }
    }
    else if (local_30 == 2) {
      local_32 = true;
      local_33 = true;
      get_memory_size_type
                (&savemem,&local_32,(operation *)opcode_stream_local,
                 (operand *)(opcode_stream_local + 4),*(uint64_t *)(opcode_stream_local + 0x10));
      get_memory_size_type
                (&savemem1,&local_33,(operation *)opcode_stream_local,
                 (operand *)(opcode_stream_local + 8),*(uint64_t *)(opcode_stream_local + 0x18));
      if (((local_32 & 1U) == 0) && ((local_33 & 1U) == 0)) {
        *(byte *)((long)&_nr_ops->oper + sz) = (byte)*(undefined4 *)(opcode_stream_local + 4) | 0x80
        ;
        *(byte *)((long)&_nr_ops->oper + sz + 1) =
             (byte)*(undefined4 *)(opcode_stream_local + 8) | 0x80;
        _nr_ops = (instruction *)((long)&_nr_ops->oper + 2);
      }
      else {
        *(byte *)((long)&_nr_ops->oper + sz) = (byte)*(undefined4 *)(opcode_stream_local + 4);
        *(byte *)((long)&_nr_ops->oper + sz + 1) = (byte)*(undefined4 *)(opcode_stream_local + 8);
        *(char *)((long)&_nr_ops->oper + sz + 2) = savemem1 << 4 | savemem;
        _nr_ops = (instruction *)((long)&_nr_ops->oper + 3);
      }
    }
    switch(savemem) {
    case true:
      *(char *)((long)&_nr_ops->oper + sz) = (char)*(undefined8 *)(opcode_stream_local + 0x10);
      _nr_ops = (instruction *)((long)&_nr_ops->oper + 1);
      break;
    case true:
      *(short *)((long)&_nr_ops->oper + sz) = (short)*(undefined8 *)(opcode_stream_local + 0x10);
      _nr_ops = (instruction *)((long)&_nr_ops->oper + 2);
      break;
    case true:
      *(int *)((long)&_nr_ops->oper + sz) = (int)*(undefined8 *)(opcode_stream_local + 0x10);
      _nr_ops = (instruction *)&_nr_ops->operand1;
      break;
    case true:
      *(undefined8 *)((long)&_nr_ops->oper + sz) = *(undefined8 *)(opcode_stream_local + 0x10);
      _nr_ops = (instruction *)&_nr_ops->operand2;
    }
    switch(savemem1) {
    case true:
      *(char *)((long)&_nr_ops->oper + sz) = (char)*(undefined8 *)(opcode_stream_local + 0x18);
      _nr_ops = (instruction *)((long)&_nr_ops->oper + 1);
      break;
    case true:
      *(short *)((long)&_nr_ops->oper + sz) = (short)*(undefined8 *)(opcode_stream_local + 0x18);
      _nr_ops = (instruction *)((long)&_nr_ops->oper + 2);
      break;
    case true:
      *(int *)((long)&_nr_ops->oper + sz) = (int)*(undefined8 *)(opcode_stream_local + 0x18);
      _nr_ops = (instruction *)&_nr_ops->operand1;
      break;
    case true:
      *(undefined8 *)((long)&_nr_ops->oper + sz) = *(undefined8 *)(opcode_stream_local + 0x18);
      _nr_ops = (instruction *)&_nr_ops->operand2;
    }
    instr_local = _nr_ops;
  }
  return (uint64_t)instr_local;
}

Assistant:

uint64_t fill_vm_bytecode(const asmcode::instruction& instr, uint8_t* opcode_stream)
    {
    uint64_t sz = 0;
    if (ignore_operation_as_bytecode(instr.oper))
      return sz;
    opcode_stream[sz++] = (uint8_t)instr.oper;
    uint8_t op1mem = 0;
    uint8_t op2mem = 0;
    int nr_ops = number_of_operands(instr.oper);
    if (nr_ops == 1)
      {
      bool savemem = true;
      get_memory_size_type(op1mem, savemem, instr.oper, instr.operand1, instr.operand1_mem);
      if (savemem)
        {
        opcode_stream[sz++] = (uint8_t)instr.operand1;
        opcode_stream[sz++] = op1mem;
        }
      else
        {
        opcode_stream[sz++] = (uint8_t)instr.operand1 | operand_has_8bit_mem;
        }
      }
    else if (nr_ops == 2)
      {
      bool savemem1 = true;
      bool savemem2 = true;
      get_memory_size_type(op1mem, savemem1, instr.oper, instr.operand1, instr.operand1_mem);
      get_memory_size_type(op2mem, savemem2, instr.oper, instr.operand2, instr.operand2_mem);
      if (savemem1 || savemem2)
        {
        opcode_stream[sz++] = (uint8_t)instr.operand1;
        opcode_stream[sz++] = (uint8_t)instr.operand2;
        opcode_stream[sz++] = (uint8_t)(op2mem << 4) | op1mem;
        }
      else
        {
        opcode_stream[sz++] = (uint8_t)instr.operand1 | operand_has_8bit_mem;
        opcode_stream[sz++] = (uint8_t)instr.operand2 | operand_has_8bit_mem;
        }
      }
    switch (op1mem)
      {
      case 1: opcode_stream[sz++] = (uint8_t)instr.operand1_mem; break;
      case 2: *(reinterpret_cast<uint16_t*>(opcode_stream + sz)) = (uint16_t)instr.operand1_mem; sz += 2; break;
      case 3: *(reinterpret_cast<uint32_t*>(opcode_stream + sz)) = (uint32_t)instr.operand1_mem; sz += 4; break;
      case 4: *(reinterpret_cast<uint64_t*>(opcode_stream + sz)) = (uint64_t)instr.operand1_mem; sz += 8; break;
      default: break;
      }
    switch (op2mem)
      {
      case 1: opcode_stream[sz++] = (uint8_t)instr.operand2_mem; break;
      case 2: *(reinterpret_cast<uint16_t*>(opcode_stream + sz)) = (uint16_t)instr.operand2_mem; sz += 2; break;
      case 3: *(reinterpret_cast<uint32_t*>(opcode_stream + sz)) = (uint32_t)instr.operand2_mem; sz += 4; break;
      case 4: *(reinterpret_cast<uint64_t*>(opcode_stream + sz)) = (uint64_t)instr.operand2_mem; sz += 8; break;
      default: break;
      }
    return sz;
    /*
    switch (instr.oper)
      {
      case asmcode::LABEL: return 0;
      case asmcode::LABEL_ALIGNED: return 0;
      case asmcode::GLOBAL: return 0;
      case asmcode::COMMENT: return 0;
      case asmcode::NOP:
      {
      opcode_stream[0] = (uint8_t)instr.oper;
      return 1;
      }
      default: break;
      }
    opcode_stream[0] = (uint8_t)instr.oper;
    opcode_stream[1] = (uint8_t)instr.operand1;
    opcode_stream[2] = (uint8_t)instr.operand2;
    uint8_t op1mem = 0;
    uint8_t op2mem = 0;
    if (instr.operand1_mem != 0)
      {
      if (is_8_bit(instr.operand1_mem))
        op1mem = 1;
      else if (is_16_bit(instr.operand1_mem))
        op1mem = 2;
      else if (is_32_bit(instr.operand1_mem))
        op1mem = 3;
      else
        op1mem = 4;
      }
    if (op1mem < 4)
      {
      if (instr.operand1 == asmcode::LABELADDRESS)
        op1mem = 4;
      }
    if (op1mem < 3)
      {
      if (instr.oper == asmcode::CALL)
        op1mem = 3;
      if (instr.oper == asmcode::JMP)
        op1mem = 3;
      if (instr.oper == asmcode::JA)
        op1mem = 3;
      if (instr.oper == asmcode::JB)
        op1mem = 3;
      if (instr.oper == asmcode::JE)
        op1mem = 3;
      if (instr.oper == asmcode::JL)
        op1mem = 3;
      if (instr.oper == asmcode::JLE)
        op1mem = 3;
      if (instr.oper == asmcode::JG)
        op1mem = 3;
      if (instr.oper == asmcode::JGE)
        op1mem = 3;
      if (instr.oper == asmcode::JNE)
        op1mem = 3;
      }
    if (instr.operand2_mem != 0)
      {
      if (is_8_bit(instr.operand2_mem))
        op2mem = 1;
      else if (is_16_bit(instr.operand2_mem))
        op2mem = 2;
      else if (is_32_bit(instr.operand2_mem))
        op2mem = 3;
      else
        op2mem = 4;
      }
    if (op2mem < 4)
      {
      if (instr.operand2 == asmcode::LABELADDRESS)
        op2mem = 4;
      }
    opcode_stream[3] = (uint8_t)(op2mem << 4) | op1mem;
    uint64_t sz = 4;
    switch (op1mem)
      {
      case 1: opcode_stream[sz++] = (uint8_t)instr.operand1_mem; break;
      case 2: *(reinterpret_cast<uint16_t*>(opcode_stream + sz)) = (uint16_t)instr.operand1_mem; sz += 2; break;
      case 3: *(reinterpret_cast<uint32_t*>(opcode_stream + sz)) = (uint32_t)instr.operand1_mem; sz += 4; break;
      case 4: *(reinterpret_cast<uint64_t*>(opcode_stream + sz)) = (uint64_t)instr.operand1_mem; sz += 8; break;
      default: break;
      }
    switch (op2mem)
      {
      case 1: opcode_stream[sz++] = (uint8_t)instr.operand2_mem; break;
      case 2: *(reinterpret_cast<uint16_t*>(opcode_stream + sz)) = (uint16_t)instr.operand2_mem; sz += 2; break;
      case 3: *(reinterpret_cast<uint32_t*>(opcode_stream + sz)) = (uint32_t)instr.operand2_mem; sz += 4; break;
      case 4: *(reinterpret_cast<uint64_t*>(opcode_stream + sz)) = (uint64_t)instr.operand2_mem; sz += 8; break;
      default: break;
      }

    return sz;
    */
    }